

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.h
# Opt level: O0

void __thiscall
protozero::CopyablePtr<perfetto::protos::gen::ChromeProcessDescriptor>::CopyablePtr
          (CopyablePtr<perfetto::protos::gen::ChromeProcessDescriptor> *this,
          CopyablePtr<perfetto::protos::gen::ChromeProcessDescriptor> *other)

{
  ChromeProcessDescriptor *this_00;
  CopyablePtr<perfetto::protos::gen::ChromeProcessDescriptor> *other_local;
  CopyablePtr<perfetto::protos::gen::ChromeProcessDescriptor> *this_local;
  
  perfetto::std::
  unique_ptr<perfetto::protos::gen::ChromeProcessDescriptor,_std::default_delete<perfetto::protos::gen::ChromeProcessDescriptor>_>
  ::unique_ptr(&this->ptr_,&other->ptr_);
  this_00 = (ChromeProcessDescriptor *)operator_new(0x68);
  perfetto::protos::gen::ChromeProcessDescriptor::ChromeProcessDescriptor(this_00);
  perfetto::std::
  unique_ptr<perfetto::protos::gen::ChromeProcessDescriptor,_std::default_delete<perfetto::protos::gen::ChromeProcessDescriptor>_>
  ::reset(&other->ptr_,this_00);
  return;
}

Assistant:

CopyablePtr(CopyablePtr&& other) noexcept : ptr_(std::move(other.ptr_)) {
    other.ptr_.reset(new T());
  }